

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# applications_pool.cpp
# Opt level: O1

intrusive_ptr<cppcms::application> __thiscall
cppcms::application_specific_pool::_async_legacy_policy::get
          (_async_legacy_policy *this,service *srv)

{
  service *psVar1;
  service *in_RDX;
  
  psVar1 = srv[2].impl_.ptr_;
  if (*(int *)&(((psVar1->acceptors_).
                 super__Vector_base<std::shared_ptr<cppcms::impl::cgi::acceptor>,_std::allocator<std::shared_ptr<cppcms::impl::cgi::acceptor>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage)->
               super___shared_ptr<cppcms::impl::cgi::acceptor,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
      == -1) {
    (this->super__policy)._vptr__policy = (_func_int **)0x0;
  }
  else {
    if (srv[3].impl_.ptr_ == (service *)0x0) {
      psVar1 = (service *)get_new((application_specific_pool *)psVar1,in_RDX);
      srv[3].impl_.ptr_ = psVar1;
    }
    psVar1 = srv[3].impl_.ptr_;
    (this->super__policy)._vptr__policy = (_func_int **)psVar1;
    if (psVar1 != (service *)0x0) {
      booster::intrusive_ptr_add_ref((application *)psVar1);
    }
  }
  return (intrusive_ptr<cppcms::application>)(application *)this;
}

Assistant:

virtual booster::intrusive_ptr<application> get(cppcms::service &srv)
	{
		if(self_->flags()==-1)
			return 0;
		if(!app_)
			app_ = get_new(srv);
		return app_;
	}